

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O3

void __thiscall QAction::setActionGroup(QAction *this,QActionGroup *group)

{
  QActionPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  Data *pDVar3;
  QObject *pQVar4;
  
  this_00 = *(QActionPrivate **)&this->field_0x8;
  pDVar3 = (this_00->group).wp.d;
  if (pDVar3 == (Data *)0x0) {
    if (group == (QActionGroup *)0x0) {
      return;
    }
  }
  else {
    if ((pDVar3->strongref)._q_value.super___atomic_base<int>._M_i == 0) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = (this_00->group).wp.value;
    }
    if (pQVar4 == &group->super_QObject) {
      return;
    }
    if (((pDVar3->strongref)._q_value.super___atomic_base<int>._M_i != 0) &&
       (pQVar4 = (this_00->group).wp.value, pQVar4 != (QObject *)0x0)) {
      QActionGroup::removeAction((QActionGroup *)pQVar4,this);
    }
    if (group == (QActionGroup *)0x0) {
      bVar2 = true;
      pDVar3 = (Data *)0x0;
      goto LAB_0058e1d5;
    }
  }
  pDVar3 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&group->super_QObject);
  bVar2 = false;
LAB_0058e1d5:
  pDVar1 = (this_00->group).wp.d;
  (this_00->group).wp.d = pDVar3;
  (this_00->group).wp.value = &group->super_QObject;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(pDVar1);
    }
  }
  if (!bVar2) {
    QActionGroup::addAction(group,this);
  }
  QActionPrivate::sendDataChanged(this_00);
  return;
}

Assistant:

void QAction::setActionGroup(QActionGroup *group)
{
    Q_D(QAction);
    if (group == d->group)
        return;

    if (d->group)
        d->group->removeAction(this);
    d->group = group;
    if (group)
        group->addAction(this);
    d->sendDataChanged();
}